

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O1

void cbtNearestPointInLineSegment
               (cbtVector3 *point,cbtVector3 *line0,cbtVector3 *line1,cbtVector3 *nearestPoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  float fVar10;
  float fVar11;
  
  fVar1 = line0->m_floats[0];
  fVar2 = line0->m_floats[1];
  fVar4 = line1->m_floats[0] - fVar1;
  fVar5 = line1->m_floats[1] - fVar2;
  fVar3 = line0->m_floats[2];
  fVar6 = line1->m_floats[2] - fVar3;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),ZEXT416((uint)fVar4),ZEXT416((uint)fVar4))
  ;
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
  if (auVar7._0_4_ < 1.4210855e-14) {
    uVar9 = *(undefined8 *)(line0->m_floats + 2);
    *(undefined8 *)nearestPoint->m_floats = *(undefined8 *)line0->m_floats;
    *(undefined8 *)(nearestPoint->m_floats + 2) = uVar9;
    return;
  }
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((point->m_floats[1] - fVar2) * fVar5)),
                           ZEXT416((uint)fVar4),ZEXT416((uint)(point->m_floats[0] - fVar1)));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar6),ZEXT416((uint)(point->m_floats[2] - fVar3)));
  fVar11 = auVar8._0_4_ / auVar7._0_4_;
  fVar10 = 0.0;
  if ((0.0 <= fVar11) && (fVar10 = fVar11, 1.0 < fVar11)) {
    fVar10 = 1.0;
  }
  auVar7 = vinsertps_avx(ZEXT416((uint)(fVar1 + fVar4 * fVar10)),
                         ZEXT416((uint)(fVar2 + fVar5 * fVar10)),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)(fVar3 + fVar6 * fVar10)),0x28);
  *(undefined1 (*) [16])nearestPoint->m_floats = auVar7;
  return;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3
operator-(const cbtVector3& v1, const cbtVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return cbtVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return cbtVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return cbtVector3(
		v1.m_floats[0] - v2.m_floats[0],
		v1.m_floats[1] - v2.m_floats[1],
		v1.m_floats[2] - v2.m_floats[2]);
#endif
}